

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vulkan_mock.cpp
# Opt level: O2

PFN_vkVoidFunction shim_vkGetDeviceProcAddr(VkDevice device,char *pName)

{
  int iVar1;
  code *pcVar2;
  
  if (device != (VkDevice)0x0) {
    iVar1 = strcmp(pName,"vkDestroyDevice");
    if (iVar1 == 0) {
      pcVar2 = shim_vkDestroyDevice;
    }
    else {
      iVar1 = strcmp(pName,"vkGetDeviceQueue");
      if (iVar1 == 0) {
        pcVar2 = shim_vkGetDeviceQueue;
      }
      else {
        iVar1 = strcmp(pName,"vkCreateCommandPool");
        if (iVar1 == 0) {
          pcVar2 = shim_vkCreateCommandPool;
        }
        else {
          iVar1 = strcmp(pName,"vkCreateFence");
          if (iVar1 == 0) {
            pcVar2 = shim_vkCreateFence;
          }
          else {
            iVar1 = strcmp(pName,"vkDestroyFence");
            if (iVar1 == 0) {
              pcVar2 = shim_vkDestroyFence;
            }
            else {
              iVar1 = strcmp(pName,"vkCreateSwapchainKHR");
              if (iVar1 == 0) {
                pcVar2 = shim_vkCreateSwapchainKHR;
              }
              else {
                iVar1 = strcmp(pName,"vkGetSwapchainImagesKHR");
                if (iVar1 == 0) {
                  pcVar2 = shim_vkGetSwapchainImagesKHR;
                }
                else {
                  iVar1 = strcmp(pName,"vkCreateImageView");
                  if (iVar1 == 0) {
                    pcVar2 = shim_vkCreateImageView;
                  }
                  else {
                    iVar1 = strcmp(pName,"vkDestroyImageView");
                    if (iVar1 == 0) {
                      pcVar2 = shim_vkDestroyImageView;
                    }
                    else {
                      iVar1 = strcmp(pName,"vkDestroySwapchainKHR");
                      if (iVar1 == 0) {
                        pcVar2 = shim_vkDestroySwapchainKHR;
                      }
                      else {
                        iVar1 = strcmp(pName,"vkAcquireNextImageKHR");
                        if (iVar1 == 0) {
                          pcVar2 = shim_vkAcquireNextImageKHR;
                        }
                        else {
                          pcVar2 = (PFN_vkVoidFunction)0x0;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    return pcVar2;
  }
  return (PFN_vkVoidFunction)0x0;
}

Assistant:

VKAPI_ATTR PFN_vkVoidFunction VKAPI_CALL shim_vkGetDeviceProcAddr(VkDevice device, const char* pName) {
    if (device == VK_NULL_HANDLE) {
        return nullptr;
    }
    GPA_IMPL(vkDestroyDevice)
    GPA_IMPL(vkGetDeviceQueue)
    GPA_IMPL(vkCreateCommandPool)
    GPA_IMPL(vkCreateFence)
    GPA_IMPL(vkDestroyFence)
    GPA_IMPL(vkCreateSwapchainKHR)
    GPA_IMPL(vkGetSwapchainImagesKHR)
    GPA_IMPL(vkCreateImageView)
    GPA_IMPL(vkDestroyImageView)
    GPA_IMPL(vkDestroySwapchainKHR)
    GPA_IMPL(vkAcquireNextImageKHR)

    return nullptr;
}